

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O0

CollectionItrPair * __thiscall
Jinx::Variant::GetCollectionItr(CollectionItrPair *__return_storage_ptr__,Variant *this)

{
  bool bVar1;
  undefined1 local_40 [8];
  Variant v;
  Variant *this_local;
  
  v.field_1._24_8_ = this;
  bVar1 = IsCollectionItr(this);
  if (bVar1) {
    std::
    pair<std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>_>
    ::pair(__return_storage_ptr__,
           (pair<std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>_>
            *)&(this->field_1).m_string);
  }
  else {
    Variant((Variant *)local_40,this);
    bVar1 = ConvertTo((Variant *)local_40,CollectionItr);
    if (bVar1) {
      GetCollectionItr(__return_storage_ptr__,(Variant *)local_40);
    }
    else {
      std::
      pair<std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>_>
      ::
      pair<std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>,_true>
                (__return_storage_ptr__);
    }
    ~Variant((Variant *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t CollectionItrPair Variant::GetCollectionItr() const
	{
		if (IsCollectionItr())
			return m_collectionItrPair;
		Variant v = *this;
		if (!v.ConvertTo(ValueType::CollectionItr))
			return CollectionItrPair();
		return v.GetCollectionItr();
	}